

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::GeneratedCodeInfo_Annotation::Clear(GeneratedCodeInfo_Annotation *this)

{
  bool bVar1;
  string *default_value;
  LogMessage *other;
  LogFinisher local_8d [20];
  byte local_79;
  LogMessage local_78;
  GeneratedCodeInfo_Annotation *local_40;
  GeneratedCodeInfo_Annotation *this_local;
  InternalMetadataWithArena *local_30;
  InternalMetadataWithArena *local_28;
  undefined4 local_1c;
  HasBits<1UL> *local_18;
  InternalMetadataWithArena *local_10;
  
  local_40 = this;
  RepeatedField<int>::Clear(&this->path_);
  bVar1 = has_source_file(this);
  if (bVar1) {
    default_value = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    bVar1 = internal::ArenaStringPtr::IsDefault(&this->source_file_,default_value);
    local_79 = 0;
    if (bVar1) {
      internal::LogMessage::LogMessage
                (&local_78,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                 ,0x3c1c);
      local_79 = 1;
      other = internal::LogMessage::operator<<
                        (&local_78,
                         "CHECK failed: !source_file_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                        );
      internal::LogFinisher::operator=(local_8d,other);
    }
    if ((local_79 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_78);
    }
    internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_(&this->source_file_);
    std::__cxx11::string::clear();
  }
  local_18 = &this->_has_bits_;
  local_1c = 0;
  if ((local_18->has_bits_[0] & 6) != 0) {
    memset(&this->begin_,0,8);
  }
  this_local = (GeneratedCodeInfo_Annotation *)&this->_has_bits_;
  memset(this_local,0,4);
  local_30 = &this->_internal_metadata_;
  if (((uint)(local_30->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_28 = local_30;
    local_10 = local_30;
    internal::InternalMetadataWithArena::DoClear(local_30);
  }
  return;
}

Assistant:

void GeneratedCodeInfo_Annotation::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.GeneratedCodeInfo.Annotation)
  path_.Clear();
  if (has_source_file()) {
    GOOGLE_DCHECK(!source_file_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
    (*source_file_.UnsafeRawStringPointer())->clear();
  }
  if (_has_bits_[0 / 32] & 6u) {
    ::memset(&begin_, 0, reinterpret_cast<char*>(&end_) -
      reinterpret_cast<char*>(&begin_) + sizeof(end_));
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}